

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int moveToChild(BtCursor *pCur,u32 newPgno)

{
  char cVar1;
  BtShared *pBt;
  int iVar2;
  long lVar3;
  undefined8 in_R9;
  
  cVar1 = pCur->iPage;
  lVar3 = (long)cVar1;
  if (0x12 < lVar3) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10a85,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50",in_R9,lVar3);
    return 0xb;
  }
  pBt = pCur->pBt;
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  pCur->aiIdx[lVar3] = pCur->ix;
  pCur->apPage[lVar3] = pCur->pPage;
  pCur->ix = 0;
  pCur->iPage = cVar1 + '\x01';
  iVar2 = getAndInitPage(pBt,newPgno,&pCur->pPage,pCur,(uint)pCur->curPagerFlags);
  return iVar2;
}

Assistant:

static int moveToChild(BtCursor *pCur, u32 newPgno){
  BtShared *pBt = pCur->pBt;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->iPage<BTCURSOR_MAX_DEPTH );
  assert( pCur->iPage>=0 );
  if( pCur->iPage>=(BTCURSOR_MAX_DEPTH-1) ){
    return SQLITE_CORRUPT_BKPT;
  }
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  pCur->aiIdx[pCur->iPage] = pCur->ix;
  pCur->apPage[pCur->iPage] = pCur->pPage;
  pCur->ix = 0;
  pCur->iPage++;
  return getAndInitPage(pBt, newPgno, &pCur->pPage, pCur, pCur->curPagerFlags);
}